

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O3

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::
_mul(FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
     *__return_storage_ptr__,AbstractingUnifier *au,Numeral *k,
    FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *s)

{
  _Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
  _Var1;
  long lVar2;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar3;
  bool bVar4;
  _Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
  _Var5;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *s_1;
  long lVar6;
  pair<Kernel::TermSpec,_Kernel::RationalConstantType> *ppVar7;
  anon_class_8_1_54a3980b procArray;
  int local_54;
  RationalConstantType local_50;
  
  IntegerConstantType::IntegerConstantType(&local_50._num,&k->_num);
  IntegerConstantType::IntegerConstantType(&local_50._den,&k->_den);
  local_54 = 0;
  bVar4 = Kernel::operator==(&local_50,&local_54);
  mpz_clear(local_50._den._val);
  mpz_clear((__mpz_struct *)&local_50);
  if (bVar4) {
    memset(__return_storage_ptr__,0,0x90);
    FloorUwaState(__return_storage_ptr__);
  }
  else {
    _Var1.
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl =
         (s->ratVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ;
    lVar2 = *(long *)((long)_Var1.
                            super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                            ._M_head_impl + 0x10);
    for (lVar6 = *(long *)((long)_Var1.
                                 super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
                                 ._M_head_impl + 8); lVar6 != lVar2; lVar6 = lVar6 + 0x30) {
      RationalConstantType::operator*=((RationalConstantType *)(lVar6 + 0x10),k);
    }
    _Var5._M_head_impl =
         (s->intVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    ppVar3 = (_Var5._M_head_impl)->_cursor;
    for (ppVar7 = (_Var5._M_head_impl)->_stack; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
      RationalConstantType::operator*=(&ppVar7->second,k);
    }
    _Var5._M_head_impl =
         (s->mixVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    ppVar3 = (_Var5._M_head_impl)->_cursor;
    for (ppVar7 = (_Var5._M_head_impl)->_stack; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
      RationalConstantType::operator*=(&ppVar7->second,k);
    }
    _Var5._M_head_impl =
         (s->ratAtoms)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    ppVar3 = (_Var5._M_head_impl)->_cursor;
    for (ppVar7 = (_Var5._M_head_impl)->_stack; ppVar7 != ppVar3; ppVar7 = ppVar7 + 1) {
      RationalConstantType::operator*=(&ppVar7->second,k);
    }
    _Var5._M_head_impl =
         (s->intAtoms)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    ppVar7 = (_Var5._M_head_impl)->_stack;
    ppVar3 = (_Var5._M_head_impl)->_cursor;
    if (ppVar7 != ppVar3) {
      do {
        RationalConstantType::operator*=(&ppVar7->second,k);
        ppVar7 = ppVar7 + 1;
      } while (ppVar7 != ppVar3);
      _Var5._M_head_impl =
           (s->intAtoms)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
           ._M_head_impl;
    }
    (__return_storage_ptr__->ratVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)
           (s->ratVars)._self._M_t.
           super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
           .
           super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ;
    (s->ratVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         = (_Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
            )0x0;
    (__return_storage_ptr__->intVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl =
         (s->intVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    (s->intVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
    (__return_storage_ptr__->mixVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl =
         (s->mixVars)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    (s->mixVars)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
    (__return_storage_ptr__->ratAtoms)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl =
         (s->ratAtoms)._self._M_t.
         super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
         .
         super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
         ._M_head_impl;
    (s->ratAtoms)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
    (__return_storage_ptr__->intAtoms)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl = _Var5._M_head_impl;
    (s->intAtoms)._self._M_t.
    super___uniq_ptr_impl<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_std::default_delete<Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_>_>
    .
    super__Head_base<0UL,_Lib::Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_>_*,_false>
    ._M_head_impl = (Stack<std::pair<Kernel::TermSpec,_Kernel::RationalConstantType>_> *)0x0;
    (__return_storage_ptr__->ratVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl =
         (s->ratVarSet)._self._M_t.
         super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         .
         super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
         ._M_head_impl;
    (s->ratVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
    (__return_storage_ptr__->mixVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl =
         (s->mixVarSet)._self._M_t.
         super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         .
         super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
         ._M_head_impl;
    (s->mixVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
    (__return_storage_ptr__->intVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl =
         (s->intVarSet)._self._M_t.
         super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         .
         super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
         ._M_head_impl;
    (s->intVarSet)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
    (__return_storage_ptr__->shieldedVars)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl =
         (s->shieldedVars)._self._M_t.
         super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         ._M_t.
         super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
         .
         super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
         ._M_head_impl;
    (s->shieldedVars)._self._M_t.
    super___uniq_ptr_impl<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
    .
    super__Head_base<0UL,_Lib::DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
    ._M_head_impl = (DHSet<Kernel::VarSpec,_Lib::DefaultHash,_Lib::DefaultHash2> *)0x0;
  }
  return __return_storage_ptr__;
}

Assistant:

static FloorUwaState _mul(AbstractingUnifier& au, Numeral const& k, FloorUwaState s) {
    if (k == 0) {
      return FloorUwaState::zero();
    } else {
      auto procArray = [&](auto& sum) { 
        for (auto& s : sum) {
          s.second *= k;
        }
      };
      procArray(*s.ratVars);
      procArray(*s.intVars);
      procArray(*s.mixVars);
      procArray(*s.ratAtoms);
      procArray(*s.intAtoms);
      return s;
    }
  }